

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgsisx.c
# Opt level: O1

void sgsisx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,GlobalLU_t *Glu,
           mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  trans_t tVar6;
  rowperm_t rVar7;
  fact_t fVar8;
  yes_no_t yVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  int_t *piVar13;
  undefined4 *puVar14;
  int_t *adjncy;
  float *nzval;
  double *pdVar15;
  int_t iVar16;
  int_t iVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  undefined1 uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  float in_XMM0_Da;
  float fVar35;
  float fVar36;
  double dVar37;
  double dVar38;
  float in_XMM1_Da;
  SuperMatrix *local_1f0;
  int *local_1e8;
  int info1;
  float rowcnd;
  float colcnd;
  superlu_options_t *local_1b0;
  double *local_1a8;
  trans_t local_19c;
  byte *local_198;
  int *local_190;
  long local_188;
  int *local_180;
  int local_174;
  int local_170;
  float amax;
  double local_168;
  int *local_160;
  SuperMatrix AC;
  char norm [1];
  undefined3 uStack_137;
  
  piVar19 = (int *)B->Store;
  piVar12 = (int *)X->Store;
  lVar29 = *(long *)(piVar19 + 2);
  lVar26 = *(long *)(piVar12 + 2);
  local_188 = (long)*piVar19;
  iVar3 = *piVar12;
  uVar4 = B->ncol;
  uVar25 = (ulong)uVar4;
  uVar5 = B->nrow;
  lVar18 = (long)(int)uVar5;
  *info = 0;
  tVar6 = options->Trans;
  bVar31 = tVar6 == NOTRANS;
  rVar7 = options->RowPerm;
  bVar32 = rVar7 == LargeDiag_MC64;
  fVar8 = options->Fact;
  yVar9 = options->Equil;
  local_198 = (byte *)equed;
  local_190 = perm_c;
  local_180 = perm_r;
  local_160 = etree;
  if (fVar8 == FACTORED) {
    bVar33 = (*equed & 0xefU) == 0x42;
    bVar34 = (*equed & 0xfeU) == 0x42;
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
  }
  else {
    *equed = 'N';
    bVar33 = false;
    bVar34 = false;
  }
  iVar16 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar10 = A->nrow;
    iVar16 = -2;
    if ((((-1 < (long)iVar10) && (iVar10 == A->ncol)) &&
        (((A->Stype & ~SLU_NR) == SLU_NC &&
         ((A->Dtype == SLU_S && (iVar16 = -2, A->Mtype == SLU_GE)))))) &&
       ((options->Fact != FACTORED || (((bVar33 || (bVar34)) || (iVar16 = -6, *local_198 == 0x4e))))
       )) {
      if (bVar33) {
        fVar35 = 0.0;
        fVar36 = in_XMM1_Da;
        if (0 < iVar10) {
          lVar30 = 0;
          do {
            fVar1 = R[lVar30];
            if (fVar1 <= fVar36) {
              fVar36 = fVar1;
            }
            if (fVar35 <= fVar1) {
              fVar35 = fVar1;
            }
            lVar30 = lVar30 + 1;
          } while (iVar10 != lVar30);
        }
        if (fVar36 <= 0.0) {
          *info = -7;
        }
        else if (iVar10 < 1) {
          rowcnd = 1.0;
        }
        else {
          if (fVar36 <= in_XMM0_Da) {
            fVar36 = in_XMM0_Da;
          }
          if (in_XMM1_Da <= fVar35) {
            fVar35 = in_XMM1_Da;
          }
          rowcnd = fVar36 / fVar35;
        }
      }
      if ((bVar34) && (*info == 0)) {
        iVar10 = A->nrow;
        fVar35 = 0.0;
        fVar36 = in_XMM1_Da;
        if (0 < (long)iVar10) {
          lVar30 = 0;
          do {
            fVar1 = C[lVar30];
            if (fVar1 <= fVar36) {
              fVar36 = fVar1;
            }
            if (fVar35 <= fVar1) {
              fVar35 = fVar1;
            }
            lVar30 = lVar30 + 1;
          } while (iVar10 != lVar30);
        }
        if (fVar36 <= 0.0) {
          *info = -8;
        }
        else if (iVar10 < 1) {
          colcnd = 1.0;
        }
        else {
          if (fVar36 <= in_XMM0_Da) {
            fVar36 = in_XMM0_Da;
          }
          if (in_XMM1_Da <= fVar35) {
            fVar35 = in_XMM1_Da;
          }
          colcnd = fVar36 / fVar35;
        }
      }
      if (*info != 0) goto LAB_001085ef;
      iVar16 = -0xc;
      if (-2 < lwork) {
        iVar10 = B->ncol;
        iVar17 = -0xd;
        iVar16 = iVar17;
        if (-1 < iVar10) {
          iVar24 = 0;
          if (0 < A->nrow) {
            iVar24 = A->nrow;
          }
          iVar16 = -0xd;
          if (((iVar24 <= *piVar19) && (iVar16 = iVar17, B->Stype == SLU_DN)) &&
             ((B->Dtype == SLU_S && (B->Mtype == SLU_GE)))) {
            iVar16 = -0xe;
            if (((((-1 < X->ncol) && (iVar24 <= *piVar12)) && (iVar10 == 0 || iVar10 == X->ncol)) &&
                ((X->Stype == SLU_DN && (X->Dtype == SLU_S)))) && (X->Mtype == SLU_GE))
            goto LAB_001085ef;
          }
        }
      }
    }
  }
  *info = iVar16;
LAB_001085ef:
  if (*info == 0) {
    local_170 = sp_ienv(1);
    local_174 = sp_ienv(2);
    local_1a8 = stat->utime;
    if (A->Stype == SLU_NR) {
      bVar31 = tVar6 != NOTRANS;
      local_19c = (trans_t)(tVar6 == NOTRANS);
      piVar13 = (int_t *)A->Store;
      local_1f0 = (SuperMatrix *)superlu_malloc(0x20);
      sCreate_CompCol_Matrix
                (local_1f0,A->ncol,A->nrow,*piVar13,*(float **)(piVar13 + 2),
                 *(int_t **)(piVar13 + 4),*(int_t **)(piVar13 + 6),SLU_NC,A->Dtype,A->Mtype);
    }
    else {
      local_19c = options->Trans;
      local_1f0 = A;
    }
    if (fVar8 == FACTORED) {
      local_1e8 = (int *)0x0;
    }
    else {
      if (rVar7 == LargeDiag_MC64) {
        puVar14 = (undefined4 *)local_1f0->Store;
        local_1b0 = (superlu_options_t *)CONCAT44(local_1b0._4_4_,*puVar14);
        piVar13 = *(int_t **)(puVar14 + 6);
        adjncy = *(int_t **)(puVar14 + 4);
        nzval = *(float **)(puVar14 + 2);
        local_168 = SuperLU_timer_();
        local_1e8 = int32Malloc(uVar5);
        if (local_1e8 == (int *)0x0) {
          sprintf(norm,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm[]",0x227,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                 );
          superlu_abort_and_exit(norm);
        }
        info1 = sldperm(5,uVar5,(int_t)local_1b0,piVar13,adjncy,nzval,local_1e8,R,C);
        if (info1 == 0) {
          if (yVar9 == YES) {
            local_1b0 = options;
            if (0 < (int)uVar5) {
              lVar30 = 0;
              do {
                dVar37 = exp((double)R[lVar30]);
                R[lVar30] = (float)dVar37;
                dVar37 = exp((double)C[lVar30]);
                C[lVar30] = (float)dVar37;
                lVar30 = lVar30 + 1;
              } while (lVar18 != lVar30);
            }
            if (0 < (int)uVar5) {
              lVar30 = 0;
              do {
                lVar20 = (long)piVar13[lVar30];
                iVar10 = piVar13[lVar30 + 1];
                if (piVar13[lVar30] < iVar10) {
                  do {
                    nzval[lVar20] = R[adjncy[lVar20]] * C[lVar30] * nzval[lVar20];
                    lVar20 = lVar20 + 1;
                  } while (iVar10 != lVar20);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != lVar18);
            }
            *local_198 = 0x42;
            bVar33 = true;
            bVar34 = true;
            options = local_1b0;
          }
          if (0 < (int)uVar5) {
            lVar30 = 0;
            do {
              lVar22 = (long)piVar13[lVar30];
              lVar20 = lVar30 + 1;
              if (piVar13[lVar30] < piVar13[lVar30 + 1]) {
                do {
                  adjncy[lVar22] = local_1e8[adjncy[lVar22]];
                  lVar22 = lVar22 + 1;
                } while (lVar22 < piVar13[lVar20]);
              }
              lVar30 = lVar20;
            } while (lVar20 != lVar18);
          }
        }
        else {
          superlu_free(local_1e8);
          local_1e8 = (int *)0x0;
          bVar32 = false;
        }
        dVar37 = SuperLU_timer_();
        local_1a8[4] = dVar37 - local_168;
      }
      else {
        local_1e8 = (int *)0x0;
      }
      if (yVar9 == YES && !bVar32) {
        dVar37 = SuperLU_timer_();
        sgsequ(local_1f0,R,C,&rowcnd,&colcnd,&amax,&info1);
        if (info1 == 0) {
          slaqgs(local_1f0,R,C,rowcnd,colcnd,amax,(char *)local_198);
          bVar2 = *local_198;
          bVar33 = (bVar2 & 0xef) == 0x42;
          bVar34 = true;
          if (bVar2 != 0x43) {
            bVar34 = bVar2 == 0x42;
          }
        }
        dVar38 = SuperLU_timer_();
        local_1a8[4] = dVar38 - dVar37;
      }
    }
    if (fVar8 != FACTORED) {
      dVar37 = SuperLU_timer_();
      if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(options->ColPerm,local_1f0,local_190);
      }
      dVar38 = SuperLU_timer_();
      pdVar15 = local_1a8;
      *local_1a8 = dVar38 - dVar37;
      dVar37 = SuperLU_timer_();
      piVar12 = local_160;
      piVar19 = local_190;
      sp_preorder(options,local_1f0,local_190,local_160,&AC);
      dVar38 = SuperLU_timer_();
      pdVar15[3] = dVar38 - dVar37;
      dVar37 = SuperLU_timer_();
      local_1b0 = options;
      sgsitrf(options,&AC,local_174,local_170,piVar12,work,lwork,piVar19,local_180,L,U,Glu,stat,info
             );
      dVar38 = SuperLU_timer_();
      options = local_1b0;
      pdVar15[7] = dVar38 - dVar37;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
      if (bVar32) {
        uVar11 = *local_1f0->Store;
        lVar30 = *(long *)((long)local_1f0->Store + 0x10);
        piVar19 = int32Malloc(uVar5 * 2);
        if (piVar19 == (int *)0x0) {
          sprintf(norm,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm_tmp[]",0x27e,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                 );
          superlu_abort_and_exit(norm);
        }
        if (0 < (int)uVar5) {
          lVar20 = 0;
          do {
            piVar19[lVar20] = local_180[local_1e8[lVar20]];
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        if (0 < (int)uVar5) {
          lVar20 = 0;
          do {
            local_180[lVar20] = piVar19[lVar20];
            piVar19[lVar18 + local_1e8[lVar20]] = (int)lVar20;
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        if (0 < (int)uVar11) {
          uVar23 = 0;
          do {
            *(int *)(lVar30 + uVar23 * 4) = piVar19[lVar18 + *(int *)(lVar30 + uVar23 * 4)];
            uVar23 = uVar23 + 1;
          } while (uVar11 != uVar23);
        }
        superlu_free(local_1e8);
        superlu_free(piVar19);
      }
    }
    if (options->PivotGrowth != NO) {
      if (0 < *info) {
        return;
      }
      fVar35 = sPivotGrowth(A->ncol,local_1f0,local_190,L,U);
      *recip_pivot_growth = fVar35;
    }
    if (options->ConditionNumber != NO) {
      dVar37 = SuperLU_timer_();
      uVar21 = 0x49;
      if (bVar31) {
        uVar21 = 0x31;
      }
      _norm = CONCAT31(uStack_137,uVar21);
      fVar35 = slangs(norm,local_1f0);
      sgscon(norm,L,U,fVar35,rcond,stat,&info1);
      dVar38 = SuperLU_timer_();
      local_1a8[0x10] = dVar38 - dVar37;
    }
    if (0 < (int)uVar4) {
      if (bVar31) {
        if (bVar33) {
          uVar23 = 0;
          lVar18 = lVar29;
          do {
            if (0 < (int)uVar5) {
              uVar27 = 0;
              do {
                *(float *)(lVar18 + uVar27 * 4) = R[uVar27] * *(float *)(lVar18 + uVar27 * 4);
                uVar27 = uVar27 + 1;
              } while (uVar5 != uVar27);
            }
            uVar23 = uVar23 + 1;
            lVar18 = lVar18 + local_188 * 4;
          } while (uVar23 != uVar25);
        }
      }
      else if (bVar34) {
        uVar23 = 0;
        lVar18 = lVar29;
        do {
          if (0 < (int)uVar5) {
            uVar27 = 0;
            do {
              *(float *)(lVar18 + uVar27 * 4) = C[uVar27] * *(float *)(lVar18 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar5 != uVar27);
          }
          uVar23 = uVar23 + 1;
          lVar18 = lVar18 + local_188 * 4;
        } while (uVar23 != uVar25);
      }
      uVar11 = B->nrow;
      uVar23 = 1;
      if (1 < (int)uVar4) {
        uVar23 = uVar25;
      }
      lVar30 = (long)iVar3 * 4;
      uVar27 = 0;
      lVar18 = lVar26;
      do {
        if (0 < (int)uVar11) {
          uVar28 = 0;
          do {
            *(undefined4 *)(lVar18 + uVar28 * 4) = *(undefined4 *)(lVar29 + uVar28 * 4);
            uVar28 = uVar28 + 1;
          } while (uVar11 != uVar28);
        }
        uVar27 = uVar27 + 1;
        lVar18 = lVar18 + lVar30;
        lVar29 = lVar29 + local_188 * 4;
      } while (uVar27 != uVar23);
      dVar37 = SuperLU_timer_();
      sgstrs(local_19c,L,U,local_190,local_180,X,stat,&info1);
      dVar38 = SuperLU_timer_();
      local_1a8[0x11] = dVar38 - dVar37;
      if (bVar31) {
        if (bVar34) {
          uVar23 = 1;
          if (1 < (int)uVar4) {
            uVar23 = uVar25;
          }
          uVar25 = 0;
          do {
            if (0 < (int)uVar5) {
              uVar27 = 0;
              do {
                *(float *)(lVar26 + uVar27 * 4) = C[uVar27] * *(float *)(lVar26 + uVar27 * 4);
                uVar27 = uVar27 + 1;
              } while (uVar5 != uVar27);
            }
            uVar25 = uVar25 + 1;
            lVar26 = lVar26 + lVar30;
          } while (uVar25 != uVar23);
        }
      }
      else if (bVar33) {
        uVar5 = A->nrow;
        uVar23 = 1;
        if (1 < (int)uVar4) {
          uVar23 = uVar25;
        }
        uVar25 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar27 = 0;
            do {
              *(float *)(lVar26 + uVar27 * 4) = R[uVar27] * *(float *)(lVar26 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar5 != uVar27);
          }
          uVar25 = uVar25 + 1;
          lVar26 = lVar26 + lVar30;
        } while (uVar25 != uVar23);
      }
    }
    if (((options->ConditionNumber != NO) && (fVar35 = *rcond, fVar36 = smach("E"), fVar35 < fVar36)
        ) && (*info == 0)) {
      *info = A->ncol + 1;
    }
    if (fVar8 != FACTORED) {
      ilu_sQuerySpace(L,U,mem_usage);
      Destroy_CompCol_Permuted(&AC);
    }
    if (A->Stype == SLU_NR) {
      Destroy_SuperMatrix_Store(local_1f0);
      superlu_free(local_1f0);
    }
  }
  else {
    _norm = -*info;
    input_error("sgsisx",(int *)norm);
  }
  return;
}

Assistant:

void
sgsisx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X,
       float *recip_pivot_growth, float *rcond,
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info)
{

    DNformat  *Bstore, *Xstore;
    float    *Bmat, *Xmat;
    int       ldb, ldx, nrhs, n;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec, mc64;
    trans_t   trant;
    char      norm[1];
    int_t     i, j;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size, info1;
    double    t0;      /* temporary time */
    double    *utime;

    int *perm = NULL; /* permutation returned from MC64 */

    /* External functions */
    extern float slangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    n      = B->nrow;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    mc64 = (options->RowPerm == LargeDiag_MC64);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");  /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) ||
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	*info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_S || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_S || 
		      B->Mtype != SLU_GE )
		*info = -13;
	    else if ( X->ncol < 0 || Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
		      X->Stype != SLU_DN ||
		      X->Dtype != SLU_S || X->Mtype != SLU_GE )
		*info = -14;
	}
    }
    if (*info != 0) {
	int ii = -(*info);
	input_error("sgsisx", &ii);
	return;
    }

    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	sCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz,
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact ) {
	register int i, j;
	NCformat *Astore = AA->Store;
	int_t nnz = Astore->nnz;
	int_t *colptr = Astore->colptr;
	int_t *rowind = Astore->rowind;
	float *nzval = (float *)Astore->nzval;

	if ( mc64 ) {
	    t0 = SuperLU_timer_();
	    if ((perm = int32Malloc(n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm[]");

	    info1 = sldperm(5, n, nnz, colptr, rowind, nzval, perm, R, C);

	    if (info1 != 0) { /* MC64 fails, call sgsequ() later */
		mc64 = 0;
		SUPERLU_FREE(perm);
		perm = NULL;
	    } else {
	        if ( equil ) {
	            rowequ = colequ = 1;
		    for (i = 0; i < n; i++) {
		        R[i] = exp(R[i]);
		        C[i] = exp(C[i]);
		    }
		    /* scale the matrix */
		    for (j = 0; j < n; j++) {
		        for (i = colptr[j]; i < colptr[j + 1]; i++) {
			    nzval[i] *= R[rowind[i]] * C[j];
		        }
		    }
	            *equed = 'B';
                }

                /* permute the matrix */
		for (j = 0; j < n; j++) {
		    for (i = colptr[j]; i < colptr[j + 1]; i++) {
			/*nzval[i] *= R[rowind[i]] * C[j];*/
			rowind[i] = perm[rowind[i]];
		    }
		}
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}

	if ( mc64==0 && equil ) { /* Only perform equilibration, no row perm */
	    t0 = SuperLU_timer_();
	    /* Compute row and column scalings to equilibrate the matrix A. */
	    sgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);

	    if ( info1 == 0 ) {
		/* Equilibrate matrix A. */
		slaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
		rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
		colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}
    }


    if ( nofact ) {
	
	t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
	    get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;

	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	sgsitrf(options, &AC, relax, panel_size, etree, work, lwork,
                perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;

	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}

	if ( mc64 ) { /* Fold MC64's perm[] into perm_r[]. */
	    NCformat *Astore = AA->Store;
	    int_t nnz = Astore->nnz, *rowind = Astore->rowind;
	    int *perm_tmp, *iperm;
	    if ((perm_tmp = int32Malloc(2*n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm_tmp[]");
	    iperm = perm_tmp + n;
	    for (i = 0; i < n; ++i) perm_tmp[i] = perm_r[perm[i]];
	    for (i = 0; i < n; ++i) {
		perm_r[i] = perm_tmp[i];
		iperm[perm[i]] = i;
	    }

	    /* Restore A's original row indices. */
	    for (i = 0; i < nnz; ++i) rowind[i] = iperm[rowind[i]];

	    SUPERLU_FREE(perm); /* MC64 permutation */
	    SUPERLU_FREE(perm_tmp);
	}
    }

    if ( options->PivotGrowth ) {
	if ( *info > 0 ) return;

	/* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
	*recip_pivot_growth = sPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
	/* Estimate the reciprocal of the condition number of A. */
	t0 = SuperLU_timer_();
	if ( notran ) {
	    *(unsigned char *)norm = '1';
	} else {
	    *(unsigned char *)norm = 'I';
	}
	anorm = slangs(norm, AA);
	sgscon(norm, L, U, anorm, rcond, stat, &info1);
	utime[RCOND] = SuperLU_timer_() - t0;
    }

    if ( nrhs > 0 ) { /* Solve the system */

	/* Scale and permute the right-hand side if equilibration
           and permutation from MC64 were performed. */
	if ( notran ) {
	    if ( rowequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i)
		        Bmat[i + j*ldb] *= R[i];
	    }
	} else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
		for (i = 0; i < n; ++i) {
	            Bmat[i + j*ldb] *= C[i];
		}
	}

	/* Compute the solution matrix X. */
	for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
	    for (i = 0; i < B->nrow; i++)
		Xmat[i + j*ldx] = Bmat[i + j*ldb];

	t0 = SuperLU_timer_();
	sgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
	utime[SOLVE] = SuperLU_timer_() - t0;

	/* Transform the solution matrix X to a solution of the original
	   system. */
	if ( notran ) {
	    if ( colequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i) {
                        Xmat[i + j*ldx] *= C[i];
                    }
	    }
	} else { /* transposed system */
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i) {
              	        Xmat[i + j*ldx] *= R[i];
                    }
	    }
	}

    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
	/* The matrix is singular to working precision. */
	/* if ( *rcond < slamch_("E") && *info == 0) *info = A->ncol + 1; */
	if ( *rcond < smach("E") && *info == 0) *info = A->ncol + 1;
    }

    if ( nofact ) {
	ilu_sQuerySpace(L, U, mem_usage);
	Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}